

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAp_kry.c
# Opt level: O0

void PrintOutput(N_Vector cB,int ns,int mxns,WebData wdata)

{
  double dVar1;
  long lVar2;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  sunrealtype y;
  sunrealtype x;
  sunrealtype cmax;
  sunrealtype cij;
  sunrealtype *cdata;
  int jy;
  int jx;
  int i;
  double local_50;
  double local_48;
  double local_40;
  int local_24;
  int local_20;
  uint local_1c;
  
  local_50 = 0.0;
  local_48 = 0.0;
  lVar2 = N_VGetArrayPointer(in_RDI);
  for (local_1c = 1; (int)local_1c <= in_ESI; local_1c = local_1c + 1) {
    local_40 = 0.0;
    for (local_24 = 0x13; -1 < local_24; local_24 = local_24 + -1) {
      for (local_20 = 0; local_20 < 0x14; local_20 = local_20 + 1) {
        dVar1 = *(double *)
                 (lVar2 + (long)(int)((local_1c - 1) + local_20 * in_ESI + local_24 * in_EDX) * 8);
        if (local_40 < ABS(dVar1)) {
          local_48 = (double)local_20 * *(double *)(in_RCX + 0x310);
          local_50 = (double)local_24 * *(double *)(in_RCX + 0x318);
          local_40 = dVar1;
        }
      }
    }
    printf("\nMaximum sensitivity with respect to I.C. of species %d\n",(ulong)local_1c);
    printf("  mu max = %e\n",local_40);
    printf("at\n");
    printf("  x = %e\n  y = %e\n",local_48,SUB84(local_50,0));
  }
  return;
}

Assistant:

static void PrintOutput(N_Vector cB, int ns, int mxns, WebData wdata)
{
  int i, jx, jy;
  sunrealtype *cdata, cij, cmax, x, y;

  x = y = ZERO;

  cdata = N_VGetArrayPointer(cB);

  for (i = 1; i <= ns; i++)
  {
    cmax = ZERO;

    for (jy = MY - 1; jy >= 0; jy--)
    {
      for (jx = 0; jx < MX; jx++)
      {
        cij = cdata[(i - 1) + jx * ns + jy * mxns];
        if (SUNRabs(cij) > cmax)
        {
          cmax = cij;
          x    = jx * wdata->dx;
          y    = jy * wdata->dy;
        }
      }
    }

    printf("\nMaximum sensitivity with respect to I.C. of species %d\n", i);
#if defined(SUNDIALS_EXTENDED_PRECISION)
    printf("  mu max = %Le\n", cmax);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
    printf("  mu max = %e\n", cmax);
#else
    printf("  mu max = %e\n", cmax);
#endif
    printf("at\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
    printf("  x = %Le\n  y = %Le\n", x, y);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
    printf("  x = %e\n  y = %e\n", x, y);
#else
    printf("  x = %e\n  y = %e\n", x, y);
#endif
  }
}